

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O3

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  uchar *puVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  FILE *__stream;
  __jmp_buf_tag *__env;
  void *pvVar12;
  size_type *psVar13;
  IOException *pIVar14;
  long *plVar15;
  void *pvVar16;
  ulong uVar17;
  size_t __n;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong d;
  png_infop info;
  png_infop end;
  long local_180;
  allocator local_171;
  long local_170;
  int local_164;
  ulong local_160;
  string local_158;
  void *local_138;
  ulong local_130;
  long local_128;
  long local_120;
  ulong local_118;
  ulong local_110;
  long local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uint local_dc;
  int local_d8;
  uint local_d4;
  ulong local_d0;
  ulong local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  size_t local_a8;
  void *local_a0;
  FILE *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ulong local_70;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  long local_48;
  void *local_40;
  ImageU8 *local_38;
  
  local_164 = ds;
  local_128 = x;
  local_120 = y;
  iVar9 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar9 == '\0') {
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_100,name,(allocator *)&local_180);
    std::operator+(&local_90,"Can only load PNG image (",&local_100);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_158._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar13) {
      local_158.field_2._M_allocated_capacity = *psVar13;
      local_158.field_2._8_8_ = plVar15[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar13;
    }
    local_158._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_100,name,(allocator *)&local_180);
    std::operator+(&local_90,"Cannot open file (",&local_100);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_158._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar13) {
      local_158.field_2._M_allocated_capacity = *psVar13;
      local_158.field_2._8_8_ = plVar15[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar13;
    }
    local_158._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_180 = png_create_read_struct("1.6.37",0,0);
  if (local_180 == 0) {
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_170 = png_create_info_struct(local_180);
  if (local_170 == 0) {
    png_destroy_read_struct(&local_180,0);
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_108 = png_create_info_struct(local_180);
  if (local_108 == 0) {
    png_destroy_read_struct(&local_180,&local_170,0);
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_180,longjmp,200);
  iVar9 = _setjmp(__env);
  if (iVar9 != 0) {
    png_destroy_read_struct(&local_180,&local_170,&local_108);
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_100,name,&local_171);
    std::operator+(&local_90,"Cannot read PNG file (",&local_100);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_158._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar13) {
      local_158.field_2._M_allocated_capacity = *psVar13;
      local_158.field_2._8_8_ = plVar15[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar13;
    }
    local_158._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_98 = __stream;
  png_init_io(local_180,__stream);
  png_read_info(local_180,local_170);
  uVar10 = png_get_image_width(local_180,local_170);
  uVar24 = (ulong)uVar10;
  uVar11 = png_get_image_height(local_180,local_170);
  bVar7 = png_get_color_type(local_180,local_170);
  local_d4 = 1;
  if ((byte)(bVar7 - 2) < 5) {
    local_d4 = *(uint *)(&DAT_001512c0 + (ulong)(byte)(bVar7 - 2) * 4);
  }
  local_130 = (ulong)uVar11;
  if (w < 0) {
    w = (long)((long)local_164 + uVar24 + -1) / (long)local_164;
  }
  if (h < 0) {
    h = (long)(local_130 + (long)local_164 + -1) / (long)local_164;
  }
  d = (ulong)local_d4;
  local_160 = w;
  local_110 = h;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,w,h,d);
  sVar4 = image->n;
  __n = -sVar4;
  if (0 < (long)sVar4) {
    __n = sVar4;
  }
  memset(image->pixel,0,__n);
  if (bVar7 == 3) {
    png_set_palette_to_rgb(local_180);
  }
  bVar8 = png_get_bit_depth(local_180,local_170);
  uVar17 = local_130;
  if (8 < bVar8) {
    png_destroy_read_struct(&local_180,&local_170,&local_108);
    fclose(local_98);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_100,name,&local_171);
    std::operator+(&local_90,"PNG with <= 8 bits expected (",&local_100);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_158._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar13) {
      local_158.field_2._M_allocated_capacity = *psVar13;
      local_158.field_2._8_8_ = plVar15[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar13;
    }
    local_158._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_158);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (bVar8 == 8 || bVar7 != 0) {
    if ((bVar7 & 4) != 0) {
      png_set_strip_alpha(local_180);
    }
  }
  else {
    png_set_expand_gray_1_2_4_to_8(local_180);
    uVar17 = local_130;
  }
  png_read_update_info(local_180,local_170);
  iVar9 = png_get_rowbytes(local_180,local_170);
  uVar19 = 0xffffffffffffffff;
  if (-1 < (long)((long)iVar9 * uVar17)) {
    uVar19 = (long)iVar9 * uVar17;
  }
  pvVar12 = operator_new__(uVar19);
  local_138 = operator_new__(uVar17 * 8);
  if (uVar17 != 0) {
    uVar19 = 0;
    pvVar16 = pvVar12;
    do {
      *(void **)((long)local_138 + uVar19 * 8) = pvVar16;
      uVar19 = uVar19 + 1;
      pvVar16 = (void *)((long)pvVar16 + (long)iVar9);
    } while (uVar17 != uVar19);
  }
  png_read_image(local_180);
  uVar19 = local_160;
  if ((((local_164 < 2) && (local_120 == 0 && local_128 == 0)) && (local_160 == uVar24)) &&
     (local_110 == uVar17)) {
    if ((int)uVar17 != 0) {
      uVar19 = 0;
      do {
        if (uVar10 != 0) {
          uVar21 = 0;
          uVar20 = uVar21;
          do {
            uVar20 = (ulong)(int)uVar20;
            uVar23 = 0;
            do {
              puVar1 = (uchar *)(*(long *)((long)local_138 + uVar19 * 8) + uVar20);
              uVar20 = uVar20 + 1;
              image->img[uVar23][uVar19][uVar21] = *puVar1;
              uVar23 = uVar23 + 1;
            } while (d != uVar23);
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar24);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar17);
    }
  }
  else {
    uVar20 = local_160 * d * 4;
    local_40 = pvVar12;
    pvVar12 = operator_new(uVar20);
    local_b0 = pvVar12;
    if (uVar19 != 0) {
      memset(pvVar12,0,uVar20);
    }
    local_c0 = operator_new(uVar20);
    local_b8 = local_c0;
    local_a0 = pvVar12;
    if (local_160 != 0) {
      memset(local_c0,0,uVar20);
    }
    uVar19 = 0;
    if (-local_120 != 0 && local_120 < 1) {
      uVar19 = -local_120;
    }
    local_a8 = uVar20;
    if ((long)uVar19 < (long)local_110) {
      lVar18 = (long)local_164;
      uVar21 = 0;
      uVar20 = lVar18 * local_120;
      if (lVar18 * local_120 < 1) {
        uVar20 = uVar21;
      }
      local_d8 = 0;
      if (0 < local_128) {
        local_d8 = (int)local_128;
      }
      local_d8 = local_d8 * local_d4 * local_164;
      local_118 = -local_128;
      if (-local_128 == 0 || 0 < local_128) {
        local_118 = uVar21;
      }
      local_48 = local_118 * d;
      local_50 = (void *)((long)local_b8 + local_48 * 4);
      local_58 = d * 4;
      local_60 = (void *)((long)local_b0 + local_48 * 4);
      local_38 = image;
      do {
        local_68 = (local_120 + uVar19) * lVar18;
        local_c8 = uVar19;
        if ((long)uVar17 <= local_68) break;
        uVar19 = uVar20 & 0xffffffff;
        if (local_160 != 0) {
          local_dc = (uint)uVar20;
          memset(local_a0,0,local_a8);
          memset(local_c0,0,local_a8);
          uVar19 = (ulong)local_dc;
        }
        uVar20 = uVar19;
        if (0 < local_164) {
          uVar17 = (long)(int)uVar20;
          uVar19 = uVar21;
          do {
            local_70 = uVar19;
            local_d0 = uVar17;
            pvVar12 = local_60;
            pvVar16 = local_50;
            uVar17 = local_118;
            iVar9 = local_d8;
            if ((long)local_118 < (long)local_160) {
              do {
                lVar22 = (uVar17 + local_128) * lVar18;
                if ((long)uVar24 <= lVar22) break;
                lVar5 = *(long *)((long)local_138 + local_d0 * 8);
                uVar19 = uVar21;
                do {
                  iVar6 = iVar9;
                  uVar20 = uVar21;
                  do {
                    piVar2 = (int *)((long)pvVar12 + uVar20 * 4);
                    *piVar2 = *piVar2 + (uint)*(byte *)(iVar6 + lVar5 + uVar20);
                    piVar2 = (int *)((long)pvVar16 + uVar20 * 4);
                    *piVar2 = *piVar2 + 1;
                    uVar20 = uVar20 + 1;
                  } while (d != uVar20);
                } while (((long)(uVar19 + 1) < lVar18) &&
                        (lVar3 = lVar22 + uVar19, uVar19 = uVar19 + 1, iVar9 = iVar6 + (int)uVar20,
                        lVar3 + 1 < (long)uVar24));
                uVar17 = uVar17 + 1;
                pvVar12 = (void *)((long)pvVar12 + local_58);
                pvVar16 = (void *)((long)pvVar16 + local_58);
                iVar9 = iVar6 + (int)uVar20;
              } while (uVar17 != local_160);
            }
          } while (((long)(local_70 + 1) < lVar18) &&
                  (uVar17 = local_d0 + 1, uVar19 = local_70 + 1,
                  (long)(local_70 + local_68 + 1) < (long)local_130));
          uVar20 = local_d0 + 1 & 0xffffffff;
          uVar17 = local_130;
          image = local_38;
        }
        lVar22 = local_48;
        uVar19 = local_118;
        if ((long)local_118 < (long)local_160) {
          do {
            if ((long)uVar24 <= (long)((local_128 + uVar19) * lVar18)) break;
            uVar23 = uVar21;
            do {
              uVar10 = *(uint *)((long)local_b8 + uVar23 * 4 + lVar22 * 4);
              if (0 < (int)uVar10) {
                image->img[uVar23][local_c8][uVar19] =
                     (uchar)((int)((uVar10 >> 1) +
                                  *(int *)((long)local_b0 + uVar23 * 4 + lVar22 * 4)) / (int)uVar10)
                ;
              }
              uVar23 = uVar23 + 1;
            } while (d != uVar23);
            uVar19 = uVar19 + 1;
            lVar22 = lVar22 + uVar23;
          } while (uVar19 != local_160);
        }
        uVar19 = local_c8 + 1;
      } while (uVar19 != local_110);
    }
    operator_delete(local_c0);
    operator_delete(local_a0);
    pvVar12 = local_40;
  }
  operator_delete__(local_138);
  operator_delete__(pvVar12);
  png_destroy_read_struct(&local_180,&local_170,&local_108);
  fclose(local_98);
  return;
}

Assistant:

void PNGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("PNG with <= 8 bits expected ("+std::string(name)+")");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  png_read_update_info(png, info);

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[rk][jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}